

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder<testing::internal::ValueArray<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CartesianProductGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int> *in_RSI;
  tuple<testing::internal::ParamGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
  *in_RDI;
  ParamGenerator<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_> PVar1;
  tuple<testing::internal::ValueArray<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
  *in_stack_ffffffffffffff98;
  tuple<testing::internal::ParamGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
  *g;
  
  g = in_RDI;
  operator_new(0x28);
  std::
  tuple<testing::internal::ParamGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
  ::
  tuple<testing::internal::ValueArray<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>,_true>
            (in_RDI,in_stack_ffffffffffffff98);
  CartesianProductGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>::
  CartesianProductGenerator(in_RSI,g);
  ParamGenerator<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>::ParamGenerator
            ((ParamGenerator<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_> *)
             in_RDI,(ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>
                     *)in_stack_ffffffffffffff98);
  std::
  tuple<testing::internal::ParamGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
  ::~tuple((tuple<testing::internal::ParamGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
            *)0xaf42fb);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)g;
  return (ParamGenerator<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }